

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O2

Entry * __thiscall
Lib::DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::findEntry
          (DHMap<unsigned_int,_Lib::DArray<signed_char>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           *this,uint *key)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Entry *pEVar4;
  type tVar5;
  Entry *pEVar6;
  ulong uVar7;
  uint uVar8;
  Entry *pEVar9;
  
  if (this->_capacity == 0) {
    pEVar9 = (Entry *)0x0;
  }
  else {
    tVar5 = DefaultHash::hash<unsigned_int>(*key,0x811c9dc5);
    uVar1 = this->_capacity;
    uVar7 = (ulong)tVar5 % (ulong)uVar1;
    pEVar4 = this->_entries;
    uVar8 = pEVar4[uVar7].field_0._infoData;
    pEVar9 = (Entry *)0x0;
    if (uVar8 >> 2 == this->_timestamp) {
      pEVar6 = pEVar4 + uVar7;
      uVar2 = *key;
      if (pEVar6->_key == uVar2) {
        uVar8 = uVar8 & 1;
      }
      else {
        if ((uVar8 & 2) == 0) {
          return (Entry *)0x0;
        }
        do {
          uVar7 = (ulong)((int)uVar7 + uVar2 % uVar1 + (uint)(uVar2 % uVar1 == 0)) % (ulong)uVar1;
          pEVar6 = pEVar4 + uVar7;
          uVar3 = pEVar4[uVar7].field_0._infoData;
          if (uVar3 >> 2 != uVar8 >> 2) break;
        } while (pEVar6->_key != uVar2);
        uVar8 = uVar3 & 1 | (uVar3 ^ uVar8) >> 2;
      }
      pEVar9 = (Entry *)0x0;
      if (uVar8 == 0) {
        pEVar9 = pEVar6;
      }
    }
  }
  return pEVar9;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }